

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

boolean skip_variable(j_decompress_ptr cinfo)

{
  byte bVar1;
  jpeg_source_mgr *pjVar2;
  jpeg_error_mgr *pjVar3;
  boolean bVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  byte *pbVar8;
  
  pjVar2 = cinfo->src;
  sVar7 = pjVar2->bytes_in_buffer;
  if (sVar7 == 0) {
    bVar4 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar4 != 0) {
      sVar7 = pjVar2->bytes_in_buffer;
      goto LAB_0011dd40;
    }
LAB_0011ddc8:
    bVar4 = 0;
  }
  else {
LAB_0011dd40:
    bVar1 = *pjVar2->next_input_byte;
    sVar7 = sVar7 - 1;
    if (sVar7 == 0) {
      bVar4 = (*pjVar2->fill_input_buffer)(cinfo);
      if (bVar4 == 0) goto LAB_0011ddc8;
      pbVar8 = pjVar2->next_input_byte;
      sVar7 = pjVar2->bytes_in_buffer;
    }
    else {
      pbVar8 = pjVar2->next_input_byte + 1;
    }
    uVar6 = (ulong)bVar1 * 0x100;
    bVar1 = *pbVar8;
    lVar5 = bVar1 + uVar6 + -2;
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x5b;
    (pjVar3->msg_parm).i[0] = cinfo->unread_marker;
    (cinfo->err->msg_parm).i[1] = (int)lVar5;
    bVar4 = 1;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    pjVar2->next_input_byte = pbVar8 + 1;
    pjVar2->bytes_in_buffer = sVar7 - 1;
    if (2 < (uVar6 | bVar1)) {
      (*cinfo->src->skip_input_data)(cinfo,lVar5);
    }
  }
  return bVar4;
}

Assistant:

METHODDEF(boolean)
skip_variable(j_decompress_ptr cinfo)
/* Skip over an unknown or uninteresting variable-length marker */
{
  JLONG length;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker, (int)length);

  INPUT_SYNC(cinfo);            /* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long)length);

  return TRUE;
}